

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O1

void event_once_cb(int fd,short events,void *arg)

{
  void *pvVar1;
  undefined6 in_register_00000032;
  undefined4 in_register_0000003c;
  
  (**(code **)((long)arg + 0x90))
            (CONCAT44(in_register_0000003c,fd),CONCAT62(in_register_00000032,events),
             *(undefined8 *)((long)arg + 0x98));
  pvVar1 = *(void **)(*(long *)((long)arg + 0x50) + 0x1b0);
  if (pvVar1 != (void *)0x0) {
    (*evthread_lock_fns_.lock)(0,pvVar1);
  }
  if (*arg != 0) {
    *(undefined8 *)(*arg + 8) = *(undefined8 *)((long)arg + 8);
  }
  **(undefined8 **)((long)arg + 8) = *arg;
  pvVar1 = *(void **)(*(long *)((long)arg + 0x50) + 0x1b0);
  if (pvVar1 != (void *)0x0) {
    (*evthread_lock_fns_.unlock)(0,pvVar1);
  }
  event_debug_assert_not_added_((event *)((long)arg + 0x10));
  event_debug_note_teardown_((event *)((long)arg + 0x10));
  *(byte *)((long)arg + 0x20) = *(byte *)((long)arg + 0x20) & 0x7f;
  if (mm_free_fn_ != (_func_void_void_ptr *)0x0) {
    (*mm_free_fn_)(arg);
    return;
  }
  free(arg);
  return;
}

Assistant:

static void
event_once_cb(evutil_socket_t fd, short events, void *arg)
{
	struct event_once *eonce = arg;

	(*eonce->cb)(fd, events, eonce->arg);
	EVBASE_ACQUIRE_LOCK(eonce->ev.ev_base, th_base_lock);
	LIST_REMOVE(eonce, next_once);
	EVBASE_RELEASE_LOCK(eonce->ev.ev_base, th_base_lock);
	event_debug_unassign(&eonce->ev);
	mm_free(eonce);
}